

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__write_hdr_scanline
               (stbi__write_context *s,int width,int ncomp,uchar *scratch,float *scanline)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int len;
  long lVar5;
  long lVar6;
  int len_1;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uchar *puVar10;
  bool bVar11;
  uchar rgbe [4];
  float local_68;
  undefined8 local_64;
  uchar scanlineheader [4];
  
  uVar1 = (ushort)width << 8 | (ushort)width >> 8;
  scanlineheader[2] = (char)uVar1;
  scanlineheader[3] = (char)(uVar1 >> 8);
  scanlineheader[0] = '\x02';
  scanlineheader[1] = '\x02';
  if (width - 0x8000U < 0xffff8008) {
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
      if (ncomp - 3U < 2) {
        local_64 = *(undefined8 *)(scanline + 1);
        local_68 = *scanline;
      }
      else {
        local_68 = *scanline;
        local_64 = CONCAT44(local_68,local_68);
      }
      stbiw__linear_to_rgbe(rgbe,&local_68);
      (*s->func)(s->context,rgbe,4);
      scanline = scanline + ncomp;
    }
  }
  else {
    uVar8 = (ulong)(uint)width;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      if (ncomp - 3U < 2) {
        local_64 = *(undefined8 *)(scanline + 1);
        local_68 = *scanline;
      }
      else {
        local_68 = *scanline;
        local_64 = CONCAT44(local_68,local_68);
      }
      stbiw__linear_to_rgbe(rgbe,&local_68);
      scratch[uVar9] = rgbe[0];
      scratch[uVar9 + uVar8] = rgbe[1];
      scratch[uVar9 + (uint)(width * 2)] = rgbe[2];
      scratch[uVar9 + (uint)(width * 3)] = rgbe[3];
      scanline = scanline + ncomp;
    }
    (*s->func)(s->context,scanlineheader,4);
    puVar10 = scratch;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      lVar5 = lVar6 * uVar8;
      iVar7 = 0;
      while (iVar7 < width) {
        iVar3 = iVar7;
        for (lVar2 = (long)iVar7 + 2;
            (iVar4 = width, lVar2 < (long)uVar8 &&
            ((puVar10[lVar2 + -2] != puVar10[lVar2 + -1] ||
             (iVar4 = iVar3, puVar10[lVar2 + -2] != puVar10[lVar2])))); lVar2 = lVar2 + 1) {
          iVar3 = iVar3 + 1;
        }
        while( true ) {
          iVar3 = iVar4 - iVar7;
          if (iVar3 == 0 || iVar4 < iVar7) break;
          if (0x7f < iVar3) {
            iVar3 = 0x80;
          }
          stbiw__write_dump_data(s,iVar3,scratch + iVar7 + lVar5);
          iVar7 = iVar7 + iVar3;
        }
        if (iVar4 + 2 < width) {
          for (uVar9 = (ulong)iVar4; (long)uVar9 < (long)uVar8; uVar9 = uVar9 + 1) {
            if (puVar10[uVar9] != scratch[iVar7 + lVar5]) goto LAB_001aeaa1;
          }
          uVar9 = (ulong)(uint)width;
LAB_001aeaa1:
          for (; iVar3 = (int)uVar9 - iVar7, iVar3 != 0 && iVar7 <= (int)uVar9;
              iVar7 = iVar7 + iVar3) {
            if (0x7e < iVar3) {
              iVar3 = 0x7f;
            }
            stbiw__write_run_data(s,iVar3,scratch[iVar7 + lVar5]);
          }
        }
      }
      puVar10 = puVar10 + uVar8;
    }
  }
  return;
}

Assistant:

void stbiw__write_hdr_scanline(stbi__write_context *s, int width, int ncomp, unsigned char *scratch, float *scanline)
{
   unsigned char scanlineheader[4] = { 2, 2, 0, 0 };
   unsigned char rgbe[4];
   float linear[3];
   int x;

   scanlineheader[2] = (width&0xff00)>>8;
   scanlineheader[3] = (width&0x00ff);

   /* skip RLE for images too small or large */
   if (width < 8 || width >= 32768) {
      for (x=0; x < width; x++) {
         switch (ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         s->func(s->context, rgbe, 4);
      }
   } else {
      int c,r;
      /* encode into scratch buffer */
      for (x=0; x < width; x++) {
         switch(ncomp) {
            case 4: /* fallthrough */
            case 3: linear[2] = scanline[x*ncomp + 2];
                    linear[1] = scanline[x*ncomp + 1];
                    linear[0] = scanline[x*ncomp + 0];
                    break;
            default:
                    linear[0] = linear[1] = linear[2] = scanline[x*ncomp + 0];
                    break;
         }
         stbiw__linear_to_rgbe(rgbe, linear);
         scratch[x + width*0] = rgbe[0];
         scratch[x + width*1] = rgbe[1];
         scratch[x + width*2] = rgbe[2];
         scratch[x + width*3] = rgbe[3];
      }

      s->func(s->context, scanlineheader, 4);

      /* RLE each component separately */
      for (c=0; c < 4; c++) {
         unsigned char *comp = &scratch[width*c];

         x = 0;
         while (x < width) {
            // find first run
            r = x;
            while (r+2 < width) {
               if (comp[r] == comp[r+1] && comp[r] == comp[r+2])
                  break;
               ++r;
            }
            if (r+2 >= width)
               r = width;
            // dump up to first run
            while (x < r) {
               int len = r-x;
               if (len > 128) len = 128;
               stbiw__write_dump_data(s, len, &comp[x]);
               x += len;
            }
            // if there's a run, output it
            if (r+2 < width) { // same test as what we break out of in search loop, so only true if we break'd
               // find next byte after run
               while (r < width && comp[r] == comp[x])
                  ++r;
               // output run up to r
               while (x < r) {
                  int len = r-x;
                  if (len > 127) len = 127;
                  stbiw__write_run_data(s, len, comp[x]);
                  x += len;
               }
            }
         }
      }
   }
}